

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.cpp
# Opt level: O1

void __thiscall
llvm::ManagedStaticBase::RegisterManagedStatic
          (ManagedStaticBase *this,_func_void_ptr *Creator,_func_void_void_ptr *Deleter)

{
  Mutex *this_00;
  bool bVar1;
  void *pvVar2;
  
  if (Creator == (_func_void_ptr *)0x0) {
    __assert_fail("Creator",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                  ,0x25,
                  "void llvm::ManagedStaticBase::RegisterManagedStatic(void *(*)(), void (*)(void *)) const"
                 );
  }
  bVar1 = llvm_is_multithreaded();
  if (bVar1) {
    std::call_once<void(&)()>(&mutex_init_flag,initializeMutex);
    this_00 = ManagedStaticMutex;
    sys::MutexImpl::acquire(&ManagedStaticMutex->impl);
    if ((this->Ptr)._M_b._M_p == (__pointer_type)0x0) {
      pvVar2 = (*Creator)();
      (this->Ptr)._M_b._M_p = pvVar2;
      this->DeleterFn = Deleter;
      this->Next = StaticList;
      StaticList = this;
    }
    sys::MutexImpl::release(&this_00->impl);
    return;
  }
  if ((((this->Ptr)._M_b._M_p == (__pointer_type)0x0) &&
      (this->DeleterFn == (_func_void_void_ptr *)0x0)) && (this->Next == (ManagedStaticBase *)0x0))
  {
    pvVar2 = (*Creator)();
    LOCK();
    (this->Ptr)._M_b._M_p = pvVar2;
    UNLOCK();
    this->DeleterFn = Deleter;
    this->Next = StaticList;
    StaticList = this;
    return;
  }
  __assert_fail("!Ptr && !DeleterFn && !Next && \"Partially initialized ManagedStatic!?\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ManagedStatic.cpp"
                ,0x35,
                "void llvm::ManagedStaticBase::RegisterManagedStatic(void *(*)(), void (*)(void *)) const"
               );
}

Assistant:

void ManagedStaticBase::RegisterManagedStatic(void *(*Creator)(),
                                              void (*Deleter)(void*)) const {
  assert(Creator);
  if (llvm_is_multithreaded()) {
    MutexGuard Lock(*getManagedStaticMutex());

    if (!Ptr.load(std::memory_order_relaxed)) {
      void *Tmp = Creator();

      Ptr.store(Tmp, std::memory_order_release);
      DeleterFn = Deleter;

      // Add to list of managed statics.
      Next = StaticList;
      StaticList = this;
    }
  } else {
    assert(!Ptr && !DeleterFn && !Next &&
           "Partially initialized ManagedStatic!?");
    Ptr = Creator();
    DeleterFn = Deleter;

    // Add to list of managed statics.
    Next = StaticList;
    StaticList = this;
  }
}